

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O3

void vector_push_back(vector v,void *element)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *__dest;
  
  if (v != (vector)0x0) {
    if ((v->size == v->capacity) && (iVar1 = vector_reserve(v,v->size * 2), iVar1 != 0)) {
      log_write_impl_va("metacall",0x132,"vector_push_back",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
      return;
    }
    __n = v->type_size;
    if (v->data == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      uVar2 = v->size * __n;
      uVar3 = v->capacity * __n;
      __dest = (void *)0x0;
      if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
        __dest = (void *)((long)v->data + uVar2);
      }
    }
    memcpy(__dest,element,__n);
    v->size = v->size + 1;
  }
  return;
}

Assistant:

void vector_push_back(vector v, void *element)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return;
			}
		}

		memcpy(vector_data_offset_bytes(v, v->size * v->type_size), element, v->type_size);

		++v->size;
	}
}